

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<long,_double>::swap(Map<long,_double> *this,Map<long,_double> *other)

{
  undefined1 local_30 [8];
  Map<long,_double> copy;
  Map<long,_double> *other_local;
  Map<long,_double> *this_local;
  
  copy.elements_ = (InnerMap *)other;
  if (this->arena_ == other->arena_) {
    std::swap<int>(&this->default_enum_value_,&other->default_enum_value_);
    std::swap<google::protobuf::Map<long,double>::InnerMap*>
              (&this->elements_,(InnerMap **)&(copy.elements_)->seed_);
  }
  else {
    Map((Map<long,_double> *)local_30,this);
    operator=(this,(Map<long,_double> *)copy.elements_);
    operator=((Map<long,_double> *)copy.elements_,(Map<long,_double> *)local_30);
    ~Map((Map<long,_double> *)local_30);
  }
  return;
}

Assistant:

void swap(Map& other) {
    if (arena_ == other.arena_) {
      std::swap(default_enum_value_, other.default_enum_value_);
      std::swap(elements_, other.elements_);
    } else {
      // TODO(zuguang): optimize this. The temporary copy can be allocated
      // in the same arena as the other message, and the "other = copy" can
      // be replaced with the fast-path swap above.
      Map copy = *this;
      *this = other;
      other = copy;
    }
  }